

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

SmallVector<spirv_cross::EntryPoint,_8UL> * __thiscall
spirv_cross::Compiler::get_entry_points_and_stages
          (SmallVector<spirv_cross::EntryPoint,_8UL> *__return_storage_ptr__,Compiler *this)

{
  __node_base *p_Var1;
  EntryPoint local_40;
  
  (__return_storage_ptr__->super_VectorView<spirv_cross::EntryPoint>).buffer_size = 0;
  (__return_storage_ptr__->super_VectorView<spirv_cross::EntryPoint>).ptr =
       (EntryPoint *)&__return_storage_ptr__->stack_storage;
  __return_storage_ptr__->buffer_capacity = 8;
  p_Var1 = &(this->ir).entry_points._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    ::std::__cxx11::string::string((string *)&local_40,(string *)(p_Var1 + 7));
    local_40.execution_model = *(ExecutionModel *)&p_Var1[0x1f]._M_nxt;
    SmallVector<spirv_cross::EntryPoint,_8UL>::push_back(__return_storage_ptr__,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

SmallVector<EntryPoint> Compiler::get_entry_points_and_stages() const
{
	SmallVector<EntryPoint> entries;
	for (auto &entry : ir.entry_points)
		entries.push_back({ entry.second.orig_name, entry.second.model });
	return entries;
}